

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O0

LY_ERR lyb_parse_siblings(lyd_lyb_ctx *lybctx,lyd_node *parent,lyd_node **first_p,ly_set *parsed)

{
  LY_ERR LVar1;
  long local_58;
  long local_48;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  ly_bool top_level;
  ly_set *parsed_local;
  lyd_node **first_p_local;
  lyd_node *parent_local;
  lyd_lyb_ctx *lybctx_local;
  
  if (lybctx->lybctx->siblings == (lyd_lyb_sibling *)0x0) {
    local_48 = 0;
  }
  else {
    local_48 = *(long *)&lybctx->lybctx->siblings[-1].inner_chunks;
  }
  lybctx_local._4_4_ = lyb_read_start_siblings(lybctx->lybctx);
  if (lybctx_local._4_4_ == LY_SUCCESS) {
    do {
      if (lybctx->lybctx->siblings == (lyd_lyb_sibling *)0x0) {
        local_58 = 0;
      }
      else {
        local_58 = *(long *)&lybctx->lybctx->siblings[-1].inner_chunks;
      }
      if (lybctx->lybctx->siblings[local_58 + -1].written == 0) break;
      LVar1 = lyb_parse_node(lybctx,parent,first_p,parsed);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
    } while ((local_48 != 0) || ((lybctx->int_opts & 0x20) != 0));
    lybctx_local._4_4_ = lyb_read_stop_siblings(lybctx->lybctx);
    if (lybctx_local._4_4_ == LY_SUCCESS) {
      lybctx_local._4_4_ = LY_SUCCESS;
    }
  }
  return lybctx_local._4_4_;
}

Assistant:

static LY_ERR
lyb_parse_siblings(struct lyd_lyb_ctx *lybctx, struct lyd_node *parent, struct lyd_node **first_p,
        struct ly_set *parsed)
{
    ly_bool top_level;

    top_level = !LY_ARRAY_COUNT(lybctx->lybctx->siblings);

    /* register a new siblings */
    LY_CHECK_RET(lyb_read_start_siblings(lybctx->lybctx));

    while (LYB_LAST_SIBLING(lybctx->lybctx).written) {
        LY_CHECK_RET(lyb_parse_node(lybctx, parent, first_p, parsed));

        if (top_level && !(lybctx->int_opts & LYD_INTOPT_WITH_SIBLINGS)) {
            break;
        }
    }

    /* end the siblings */
    LY_CHECK_RET(lyb_read_stop_siblings(lybctx->lybctx));

    return LY_SUCCESS;
}